

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.hpp
# Opt level: O2

void __thiscall
csv::internals::ThreadSafeDeque<csv::CSVRow>::ThreadSafeDeque
          (ThreadSafeDeque<csv::CSVRow> *this,size_t notify_size)

{
  this->_is_waitable = false;
  this->_notify_size = notify_size;
  (this->_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->_lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->_cond);
  std::_Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>::_Deque_base
            (&(this->data).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>);
  return;
}

Assistant:

ThreadSafeDeque(const ThreadSafeDeque& other) {
                this->data = other.data;
                this->_notify_size = other._notify_size;
            }